

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int makeSorterRecord(Parse *pParse,SortCtx *pSort,Select *pSelect,int regBase,int nBase)

{
  int iVar1;
  int in_ECX;
  Vdbe *in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int regOut;
  Vdbe *v;
  int nOBSat;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd8;
  int p2;
  
  p2 = *(int *)(in_RSI + 8);
  iVar1 = *(int *)(in_RDI + 0x3c) + 1;
  *(int *)(in_RDI + 0x3c) = iVar1;
  if (*(long *)(in_RSI + 0x28) != 0) {
    innerLoopLoadRow(*(Parse **)(in_RDI + 0x10),(Select *)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                     (RowLoadInfo *)0x21074c);
  }
  sqlite3VdbeAddOp3(in_RDX,in_ECX,in_R8D,p2,in_stack_ffffffffffffffd8);
  return iVar1;
}

Assistant:

static int makeSorterRecord(
  Parse *pParse,
  SortCtx *pSort,
  Select *pSelect,
  int regBase,
  int nBase
){
  int nOBSat = pSort->nOBSat;
  Vdbe *v = pParse->pVdbe;
  int regOut = ++pParse->nMem;
  if( pSort->pDeferredRowLoad ){
    innerLoopLoadRow(pParse, pSelect, pSort->pDeferredRowLoad);
  }
  sqlite3VdbeAddOp3(v, OP_MakeRecord, regBase+nOBSat, nBase-nOBSat, regOut);
  return regOut;
}